

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackExternalGenerator::InstallCMakeProject
          (cmCPackExternalGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  bool bVar1;
  bool componentInstall_local;
  string *component_local;
  mode_t *default_dir_mode_local;
  string *baseTempInstallDirectory_local;
  string *installDirectory_local;
  bool setDestDir_local;
  cmCPackExternalGenerator *this_local;
  
  bVar1 = StagingEnabled(this);
  if (bVar1) {
    this_local._4_4_ =
         cmCPackGenerator::InstallCMakeProject
                   (&this->super_cmCPackGenerator,setDestDir,installDirectory,
                    baseTempInstallDirectory,default_dir_mode,component,componentInstall,
                    installSubDirectory,buildConfig,absoluteDestFiles);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackExternalGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  if (this->StagingEnabled()) {
    return cmCPackGenerator::InstallCMakeProject(
      setDestDir, installDirectory, baseTempInstallDirectory, default_dir_mode,
      component, componentInstall, installSubDirectory, buildConfig,
      absoluteDestFiles);
  }

  return 1;
}